

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
      *this)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>
          ::val((FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>
                 *)0x1f12e1a);
  vVar2 = FadExpr<FadFuncCos<Fad<double>_>_>::val((FadExpr<FadFuncCos<Fad<double>_>_> *)0x1f12e2d);
  return vVar1 * vVar2;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}